

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3RefillIndex(Parse *pParse,Index *pIndex,int memRootPage)

{
  ushort uVar1;
  int iCur;
  Table *pTab;
  sqlite3 *db;
  int iVar2;
  int iVar3;
  int iVar4;
  int regOut;
  Vdbe *p;
  int p1;
  int iDest;
  int local_5c;
  int iPartIdxLabel;
  KeyInfo *local_38;
  
  pTab = pIndex->pTable;
  iCur = pParse->nTab;
  pParse->nTab = iCur + 2;
  db = pParse->db;
  iVar2 = sqlite3SchemaToIndex(db,pIndex->pSchema);
  iVar3 = sqlite3AuthCheck(pParse,0x1b,pIndex->zName,(char *)0x0,db->aDb[iVar2].zDbSName);
  if (iVar3 == 0) {
    sqlite3TableLock(pParse,iVar2,pTab->tnum,'\x01',pTab->zName);
    p = sqlite3GetVdbe(pParse);
    if (p != (Vdbe *)0x0) {
      local_5c = memRootPage;
      if (memRootPage < 0) {
        local_5c = pIndex->tnum;
      }
      local_38 = sqlite3KeyInfoOfIndex(pParse,pIndex);
      iVar3 = pParse->nTab;
      pParse->nTab = iVar3 + 1;
      uVar1 = pIndex->nKeyCol;
      if (local_38 != (KeyInfo *)0x0) {
        local_38->nRef = local_38->nRef + 1;
      }
      p1 = iCur + 1;
      sqlite3VdbeAddOp4(p,0x6d,iVar3,0,(uint)uVar1,(char *)local_38,-9);
      sqlite3OpenTable(pParse,iCur,iVar2,pTab,0x68);
      iVar4 = sqlite3VdbeAddOp2(p,0x25,iCur,0);
      regOut = sqlite3GetTempReg(pParse);
      sqlite3GenerateIndexKey(pParse,pIndex,iCur,regOut,0,&iPartIdxLabel,(Index *)0x0,0);
      sqlite3VdbeAddOp2(p,0x7d,iVar3,regOut);
      sqlite3ResolvePartIdxLabel(pParse,iPartIdxLabel);
      sqlite3VdbeAddOp2(p,7,iCur,iVar4 + 1);
      sqlite3VdbeJumpHere(p,iVar4);
      if (memRootPage < 0) {
        sqlite3VdbeAddOp2(p,0x83,local_5c,iVar2);
      }
      sqlite3VdbeAddOp4(p,0x69,p1,local_5c,iVar2,(char *)local_38,-9);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = (ushort)(-1 < memRootPage) * 0x10 + 1;
      }
      iVar4 = sqlite3VdbeAddOp2(p,0x23,iVar3,0);
      iVar2 = p->nOp;
      if (pIndex->onError != '\0') {
        iDest = iVar2 + 3;
        sqlite3VdbeGoto(p,iDest);
        iVar2 = p->nOp;
        sqlite3VdbeAddOp4Int(p,0x78,iVar3,iDest,regOut,(uint)pIndex->nKeyCol);
        sqlite3UniqueConstraint(pParse,2,pIndex);
      }
      sqlite3VdbeAddOp3(p,0x79,iVar3,regOut,p1);
      sqlite3VdbeAddOp3(p,0x21,p1,0,-1);
      sqlite3VdbeAddOp2(p,0x7e,p1,regOut);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = 0x10;
      }
      sqlite3ReleaseTempReg(pParse,regOut);
      sqlite3VdbeAddOp2(p,3,iVar3,iVar2);
      sqlite3VdbeJumpHere(p,iVar4);
      sqlite3VdbeAddOp1(p,0x70,iCur);
      sqlite3VdbeAddOp1(p,0x70,p1);
      sqlite3VdbeAddOp1(p,0x70,iVar3);
    }
  }
  return;
}

Assistant:

static void sqlite3RefillIndex(Parse *pParse, Index *pIndex, int memRootPage){
  Table *pTab = pIndex->pTable;  /* The table that is indexed */
  int iTab = pParse->nTab++;     /* Btree cursor used for pTab */
  int iIdx = pParse->nTab++;     /* Btree cursor used for pIndex */
  int iSorter;                   /* Cursor opened by OpenSorter (if in use) */
  int addr1;                     /* Address of top of loop */
  int addr2;                     /* Address to jump to for next iteration */
  int tnum;                      /* Root page of index */
  int iPartIdxLabel;             /* Jump to this label to skip a row */
  Vdbe *v;                       /* Generate code into this virtual machine */
  KeyInfo *pKey;                 /* KeyInfo for index */
  int regRecord;                 /* Register holding assembled index record */
  sqlite3 *db = pParse->db;      /* The database connection */
  int iDb = sqlite3SchemaToIndex(db, pIndex->pSchema);

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( sqlite3AuthCheck(pParse, SQLITE_REINDEX, pIndex->zName, 0,
      db->aDb[iDb].zDbSName ) ){
    return;
  }
#endif

  /* Require a write-lock on the table to perform this operation */
  sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);

  v = sqlite3GetVdbe(pParse);
  if( v==0 ) return;
  if( memRootPage>=0 ){
    tnum = memRootPage;
  }else{
    tnum = pIndex->tnum;
  }
  pKey = sqlite3KeyInfoOfIndex(pParse, pIndex);
  assert( pKey!=0 || db->mallocFailed || pParse->nErr );

  /* Open the sorter cursor if we are to use one. */
  iSorter = pParse->nTab++;
  sqlite3VdbeAddOp4(v, OP_SorterOpen, iSorter, 0, pIndex->nKeyCol, (char*)
                    sqlite3KeyInfoRef(pKey), P4_KEYINFO);

  /* Open the table. Loop through all rows of the table, inserting index
  ** records into the sorter. */
  sqlite3OpenTable(pParse, iTab, iDb, pTab, OP_OpenRead);
  addr1 = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, 0); VdbeCoverage(v);
  regRecord = sqlite3GetTempReg(pParse);

  sqlite3GenerateIndexKey(pParse,pIndex,iTab,regRecord,0,&iPartIdxLabel,0,0);
  sqlite3VdbeAddOp2(v, OP_SorterInsert, iSorter, regRecord);
  sqlite3ResolvePartIdxLabel(pParse, iPartIdxLabel);
  sqlite3VdbeAddOp2(v, OP_Next, iTab, addr1+1); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);
  if( memRootPage<0 ) sqlite3VdbeAddOp2(v, OP_Clear, tnum, iDb);
  sqlite3VdbeAddOp4(v, OP_OpenWrite, iIdx, tnum, iDb, 
                    (char *)pKey, P4_KEYINFO);
  sqlite3VdbeChangeP5(v, OPFLAG_BULKCSR|((memRootPage>=0)?OPFLAG_P2ISREG:0));

  addr1 = sqlite3VdbeAddOp2(v, OP_SorterSort, iSorter, 0); VdbeCoverage(v);
  if( IsUniqueIndex(pIndex) ){
    int j2 = sqlite3VdbeCurrentAddr(v) + 3;
    sqlite3VdbeGoto(v, j2);
    addr2 = sqlite3VdbeCurrentAddr(v);
    sqlite3VdbeAddOp4Int(v, OP_SorterCompare, iSorter, j2, regRecord,
                         pIndex->nKeyCol); VdbeCoverage(v);
    sqlite3UniqueConstraint(pParse, OE_Abort, pIndex);
  }else{
    addr2 = sqlite3VdbeCurrentAddr(v);
  }
  sqlite3VdbeAddOp3(v, OP_SorterData, iSorter, regRecord, iIdx);
  sqlite3VdbeAddOp3(v, OP_Last, iIdx, 0, -1);
  sqlite3VdbeAddOp2(v, OP_IdxInsert, iIdx, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  sqlite3ReleaseTempReg(pParse, regRecord);
  sqlite3VdbeAddOp2(v, OP_SorterNext, iSorter, addr2); VdbeCoverage(v);
  sqlite3VdbeJumpHere(v, addr1);

  sqlite3VdbeAddOp1(v, OP_Close, iTab);
  sqlite3VdbeAddOp1(v, OP_Close, iIdx);
  sqlite3VdbeAddOp1(v, OP_Close, iSorter);
}